

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMoveToCcr<(moira::Instr)75,(moira::Mode)8,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  StrWriter *pSVar5;
  long lVar6;
  char cVar7;
  Ea<(moira::Mode)8,_(moira::Size)1> src;
  Ea<(moira::Mode)8,_(moira::Size)1> local_34;
  
  local_34.reg = op & 7;
  local_34.pc = *addr;
  *addr = local_34.pc + 2;
  iVar2 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[5])(this);
  local_34.ext1 = uVar3 & 0xffff | iVar2 << 0x10;
  pcVar4 = "move";
  if (str->upper != false) {
    pcVar4 = "MOVE";
  }
  cVar7 = *pcVar4;
  while (cVar7 != '\0') {
    pcVar4 = pcVar4 + 1;
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = cVar7;
    cVar7 = *pcVar4;
  }
  iVar2 = (this->tab).raw;
  while (pcVar4 = str->ptr, pcVar4 < str->base + iVar2) {
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  pSVar5 = StrWriter::operator<<(str,&local_34);
  cVar7 = ',';
  lVar6 = 1;
  do {
    pcVar4 = pSVar5->ptr;
    pSVar5->ptr = pcVar4 + 1;
    *pcVar4 = cVar7;
    cVar7 = ", CCR"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  return;
}

Assistant:

void
Moira::dasmMoveToCcr(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,Byte> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src << ", CCR";
}